

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void printNNCompUsage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "usage: fasttext nn <model> <k> <factor> <addWo>\n\n");
  poVar1 = std::operator<<(poVar1,"  <model>      model filename\n");
  poVar1 = std::operator<<(poVar1,"  <k>          predict top k labels\n");
  poVar1 = std::operator<<(poVar1,
                           "  <factor>     word embedding weight factor. when -1 then use the model default factor.\n"
                          );
  poVar1 = std::operator<<(poVar1,"  <addWo>      weight for adding Wo as word embedding\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printNNCompUsage() {
    std::cout << "usage: fasttext nn <model> <k> <factor> <addWo>\n\n"
              << "  <model>      model filename\n"
              << "  <k>          predict top k labels\n"
              << "  <factor>     word embedding weight factor. when -1 then use the model default factor.\n"
              << "  <addWo>      weight for adding Wo as word embedding\n"
              << std::endl;
}